

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DebugNodeFontGlyph(ImFont *param_1,ImFontGlyph *glyph)

{
  uint *in_RSI;
  
  Text("Codepoint: U+%04X",(ulong)(*in_RSI >> 2));
  Separator();
  Text("Visible: %d",(ulong)(*in_RSI >> 1 & 1));
  Text((char *)(double)(float)in_RSI[1],"AdvanceX: %.1f");
  Text((char *)(double)(float)in_RSI[2],(double)(float)in_RSI[3],(double)(float)in_RSI[4],
       (double)(float)in_RSI[5],"Pos: (%.2f,%.2f)->(%.2f,%.2f)");
  Text((char *)(double)(float)in_RSI[6],(double)(float)in_RSI[7],(double)(float)in_RSI[8],
       (double)(float)in_RSI[9],"UV: (%.3f,%.3f)->(%.3f,%.3f)");
  return;
}

Assistant:

void ImGui::DebugNodeFontGlyph(ImFont*, const ImFontGlyph* glyph)
{
    Text("Codepoint: U+%04X", glyph->Codepoint);
    Separator();
    Text("Visible: %d", glyph->Visible);
    Text("AdvanceX: %.1f", glyph->AdvanceX);
    Text("Pos: (%.2f,%.2f)->(%.2f,%.2f)", glyph->X0, glyph->Y0, glyph->X1, glyph->Y1);
    Text("UV: (%.3f,%.3f)->(%.3f,%.3f)", glyph->U0, glyph->V0, glyph->U1, glyph->V1);
}